

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argagg.hpp
# Opt level: O2

parser_results * __thiscall
argagg::parser::parse(parser_results *__return_storage_ptr__,parser *this,int argc,char **argv)

{
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_argagg::option_results,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_argagg::option_results>_>_>
  *this_00;
  char **ppcVar1;
  char cVar2;
  pointer pdVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  size_t sVar7;
  mapped_type *pmVar8;
  char *pcVar9;
  definition *pdVar10;
  domain_error *this_01;
  ostream *poVar11;
  unexpected_option_error *puVar12;
  unexpected_argument_error *this_02;
  option_lacks_argument_error *this_03;
  size_t sVar13;
  uint uVar14;
  pointer __x;
  char *pcVar15;
  pointer poVar16;
  long lVar17;
  ulong uVar18;
  char *arg_i_cstr;
  char *local_aa0;
  string long_flag_str;
  string local_a58;
  _Vector_base<const_char_*,_std::allocator<const_char_*>_> local_a38;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_argagg::option_results>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_argagg::option_results>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_a18;
  option_result opt_result;
  parser_map map;
  
  validate_definitions(&map,&this->definitions);
  local_a18._M_buckets = &local_a18._M_single_bucket;
  local_a18._M_bucket_count = 1;
  local_a18._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_a18._M_element_count = 0;
  local_a18._M_rehash_policy._M_max_load_factor = 1.0;
  local_a18._M_rehash_policy._4_4_ = 0;
  local_a18._M_rehash_policy._M_next_resize = 0;
  local_a18._M_single_bucket = (__node_base_ptr)0x0;
  __return_storage_ptr__->program = *argv;
  this_00 = &__return_storage_ptr__->options;
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_argagg::option_results>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_argagg::option_results>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_Hashtable(&this_00->_M_h,&local_a18);
  (__return_storage_ptr__->pos).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->pos).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->pos).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a38._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a38._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a38._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pdVar3 = (this->definitions).
           super__Vector_base<argagg::definition,_std::allocator<argagg::definition>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (__x = (this->definitions).
             super__Vector_base<argagg::definition,_std::allocator<argagg::definition>_>._M_impl.
             super__Vector_impl_data._M_start; __x != pdVar3; __x = __x + 1) {
    long_flag_str._M_dataplus._M_p = (pointer)0x0;
    long_flag_str._M_string_length = 0;
    long_flag_str.field_2._M_allocated_capacity = 0;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_argagg::option_results>
    ::pair<argagg::option_results_&,_true>
              ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_argagg::option_results>
                *)&opt_result,&__x->name,(option_results *)&long_flag_str);
    std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,argagg::option_results>,std::allocator<std::pair<std::__cxx11::string_const,argagg::option_results>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::_M_emplace<std::pair<std::__cxx11::string,argagg::option_results>>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,argagg::option_results>,std::allocator<std::pair<std::__cxx11::string_const,argagg::option_results>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)this_00,
               (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_argagg::option_results>
                *)&opt_result);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_argagg::option_results>
    ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_argagg::option_results>
             *)&opt_result);
    std::_Vector_base<argagg::option_result,_std::allocator<argagg::option_result>_>::~_Vector_base
              ((_Vector_base<argagg::option_result,_std::allocator<argagg::option_result>_> *)
               &long_flag_str);
  }
  ppcVar1 = argv + argc;
  uVar14 = 0;
  poVar16 = (pointer)0x0;
  local_aa0 = (char *)0x0;
LAB_0010c66f:
  bVar5 = false;
  do {
    while( true ) {
      argv = argv + 1;
      if (argv == ppcVar1) {
        if (uVar14 != 0) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&opt_result);
          poVar11 = std::operator<<((ostream *)&opt_result,"last option \"");
          poVar11 = std::operator<<(poVar11,local_aa0);
          poVar11 = std::operator<<(poVar11,
                                    "\" expects an argument but the parser ran out of command line "
                                   );
          std::operator<<(poVar11,"arguments to parse");
          this_03 = (option_lacks_argument_error *)__cxa_allocate_exception(0x10);
          std::__cxx11::stringbuf::str();
          option_lacks_argument_error::runtime_error(this_03,&long_flag_str);
          __cxa_throw(this_03,&option_lacks_argument_error::typeinfo,
                      std::runtime_error::~runtime_error);
        }
        std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base(&local_a38);
        std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_argagg::option_results>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_argagg::option_results>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::~_Hashtable(&local_a18);
        std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_argagg::definition_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_argagg::definition_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::~_Hashtable(&map.long_map._M_h);
        return __return_storage_ptr__;
      }
      pcVar15 = *argv;
      arg_i_cstr = pcVar15;
      sVar7 = strlen(pcVar15);
      if (uVar14 == 0 && !bVar5) break;
      if (uVar14 == 0) {
LAB_0010c756:
        if ((*pcVar15 == '-') && (pcVar15[1] == '-' && sVar7 == 2)) {
          bVar5 = true;
        }
        else {
          std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
                    (&__return_storage_ptr__->pos,&arg_i_cstr);
        }
        uVar14 = 0;
      }
      else {
        poVar16->arg = pcVar15;
        uVar14 = uVar14 - 1;
      }
    }
    bVar4 = cmd_line_arg_is_option_flag(pcVar15);
    pcVar15 = arg_i_cstr;
    if (!bVar4) goto LAB_0010c756;
    if (arg_i_cstr[1] == '-') break;
    lVar17 = -2;
    for (uVar18 = 1; uVar18 < sVar7; uVar18 = uVar18 + 1) {
      cVar2 = arg_i_cstr[uVar18];
      iVar6 = isalnum((int)cVar2);
      if (iVar6 == 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&opt_result);
        poVar11 = std::operator<<((ostream *)&opt_result,"found non-alphanumeric character \'");
        poVar11 = std::operator<<(poVar11,arg_i_cstr[uVar18]);
        poVar11 = std::operator<<(poVar11,"\' in flag group \'");
        poVar11 = std::operator<<(poVar11,arg_i_cstr);
        std::operator<<(poVar11,"\'");
        this_01 = (domain_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::domain_error::domain_error(this_01,(string *)&long_flag_str);
        __cxa_throw(this_01,&std::domain_error::typeinfo,std::domain_error::~domain_error);
      }
      pdVar10 = map.short_map._M_elems[(int)cVar2];
      if (pdVar10 == (definition *)0x0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&opt_result);
        poVar11 = std::operator<<((ostream *)&opt_result,"found unexpected flag \'");
        poVar11 = std::operator<<(poVar11,arg_i_cstr[uVar18]);
        poVar11 = std::operator<<(poVar11,"\' in flag group \'");
        poVar11 = std::operator<<(poVar11,arg_i_cstr);
        std::operator<<(poVar11,"\'");
        puVar12 = (unexpected_option_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        unexpected_option_error::runtime_error(puVar12,&long_flag_str);
        __cxa_throw(puVar12,&unexpected_option_error::typeinfo,std::runtime_error::~runtime_error);
      }
      pmVar8 = std::__detail::
               _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_argagg::option_results>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_argagg::option_results>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_argagg::option_results>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_argagg::option_results>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)this_00,&pdVar10->name);
      opt_result.arg = (char *)0x0;
      std::vector<argagg::option_result,_std::allocator<argagg::option_result>_>::
      emplace_back<argagg::option_result>(&pmVar8->all,&opt_result);
      uVar14 = pdVar10->num_args;
      if (uVar14 != 0) {
        if (sVar7 + lVar17 == 0) {
          local_aa0 = arg_i_cstr;
          poVar16 = (pmVar8->all).
                    super__Vector_base<argagg::option_result,_std::allocator<argagg::option_result>_>
                    ._M_impl.super__Vector_impl_data._M_finish + -1;
        }
        else {
          (pmVar8->all).
          super__Vector_base<argagg::option_result,_std::allocator<argagg::option_result>_>._M_impl.
          super__Vector_impl_data._M_finish[-1].arg = arg_i_cstr + -lVar17;
          uVar14 = 0;
          poVar16 = (pointer)0x0;
          local_aa0 = (char *)0x0;
        }
        goto LAB_0010c66f;
      }
      lVar17 = lVar17 + -1;
    }
    uVar14 = 0;
    poVar16 = (pointer)0x0;
    local_aa0 = (char *)0x0;
    bVar5 = false;
  } while( true );
  pcVar9 = strchr(arg_i_cstr,0x3d);
  sVar13 = (long)pcVar9 - (long)pcVar15;
  if (pcVar9 == (char *)0x0) {
    sVar13 = sVar7;
  }
  long_flag_str._M_dataplus._M_p = (pointer)&long_flag_str.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&long_flag_str,pcVar15,pcVar15 + sVar13)
  ;
  bVar5 = parser_map::known_long_flag(&map,&long_flag_str);
  if (!bVar5) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&opt_result);
    poVar11 = std::operator<<((ostream *)&opt_result,"found unexpected flag: ");
    std::operator<<(poVar11,(string *)&long_flag_str);
    puVar12 = (unexpected_option_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    unexpected_option_error::runtime_error(puVar12,&local_a58);
    __cxa_throw(puVar12,&unexpected_option_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pdVar10 = parser_map::get_definition_for_long_flag(&map,&long_flag_str);
  if ((pcVar9 != (char *)0x0) && (pdVar10->num_args == 0)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&opt_result);
    poVar11 = std::operator<<((ostream *)&opt_result,
                              "found argument for option not expecting an argument: ");
    std::operator<<(poVar11,arg_i_cstr);
    this_02 = (unexpected_argument_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    unexpected_argument_error::runtime_error(this_02,&local_a58);
    __cxa_throw(this_02,&unexpected_argument_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pmVar8 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_argagg::option_results>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_argagg::option_results>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_argagg::option_results>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_argagg::option_results>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)this_00,&pdVar10->name);
  opt_result.arg = (char *)0x0;
  std::vector<argagg::option_result,_std::allocator<argagg::option_result>_>::
  emplace_back<argagg::option_result>(&pmVar8->all,&opt_result);
  uVar14 = pdVar10->num_args;
  if (uVar14 != 0) {
    poVar16 = (pmVar8->all).
              super__Vector_base<argagg::option_result,_std::allocator<argagg::option_result>_>.
              _M_impl.super__Vector_impl_data._M_finish + -1;
    if (pcVar9 == (char *)0x0) {
      local_aa0 = arg_i_cstr;
      goto LAB_0010c8b0;
    }
    poVar16->arg = pcVar9 + 1;
  }
  uVar14 = 0;
  poVar16 = (pointer)0x0;
  local_aa0 = (char *)0x0;
LAB_0010c8b0:
  std::__cxx11::string::~string((string *)&long_flag_str);
  goto LAB_0010c66f;
}

Assistant:

inline
parser_results parser::parse(int argc, const char** argv) const
{
  // Inspect each definition to see if its valid. You may wonder "why don't
  // you do this validation on construction?" I had thought about it but
  // realized that since I've made the parser an aggregate type (granted it
  // just "aggregates" a single vector) I would need to track any changes to
  // the definitions vector and re-run the validity check in order to
  // maintain this expected "validity invariant" on the object. That would
  // then require hiding the definitions vector as a private entry and then
  // turning the parser into a thin interface (by re-exposing setters and
  // getters) to the vector methods just so that I can catch when the
  // definition has been modified. It seems much simpler to just enforce the
  // validity when you actually want to parse because it's at the moment of
  // parsing that you know the definitions are complete.
  parser_map map = validate_definitions(this->definitions);

  // Initialize the parser results that we'll be returning. Store the program
  // name (assumed to be the first command line argument) and initialize
  // everything else as empty.
  std::unordered_map<std::string, option_results> options {};
  std::vector<const char*> pos;
  parser_results results {argv[0], std::move(options), std::move(pos)};

  // Add an empty option result for each definition.
  for (const auto& defn : this->definitions) {
    option_results opt_results {{}};
    results.options.insert(
      std::make_pair(defn.name, opt_results));
  }

  // Don't start off ignoring flags. We only ignore flags after a -- shows up
  // in the command line arguments.
  bool ignore_flags = false;

  // Keep track of any options that are expecting arguments.
  const char* last_flag_expecting_args = nullptr;
  option_result* last_option_expecting_args = nullptr;
  unsigned int num_option_args_to_consume = 0;

  // Get pointers to pointers so we can treat the raw pointer array as an
  // iterator for standard library algorithms. This isn't used yet but can be
  // used to template this function to work on iterators over strings or
  // C-strings.
  const char** arg_i = argv + 1;
  const char** arg_end = argv + argc;

  while (arg_i != arg_end) {
    auto arg_i_cstr = *arg_i;
    auto arg_i_len = std::strlen(arg_i_cstr);

    // Some behavior to note: if the previous option is expecting an argument
    // then the next entry will be treated as a positional argument even if
    // it looks like a flag.
    bool treat_as_positional_argument = (
        ignore_flags
        || num_option_args_to_consume > 0
        || !cmd_line_arg_is_option_flag(arg_i_cstr)
      );
    if (treat_as_positional_argument) {

      // If last option is expecting some specific positive number of
      // arguments then give this argument to that option, *regardless of
      // whether or not the argument looks like a flag or is the special "--"
      // argument*.
      if (num_option_args_to_consume > 0) {
        last_option_expecting_args->arg = arg_i_cstr;
        --num_option_args_to_consume;
        ++arg_i;
        continue;
      }

      // Now we check if this is just "--" which is a special argument that
      // causes all following arguments to be treated as non-options and is
      // itselve discarded.
      if (std::strncmp(arg_i_cstr, "--", 2) == 0 && arg_i_len == 2) {
        ignore_flags = true;
        ++arg_i;
        continue;
      }

      // If there are no expectations for option arguments then simply use
      // this argument as a positional argument.
      results.pos.push_back(arg_i_cstr);
      ++arg_i;
      continue;
    }

    // Reset the "expecting argument" state.
    last_flag_expecting_args = nullptr;
    last_option_expecting_args = nullptr;
    num_option_args_to_consume = 0;

    // If we're at this point then we're definitely dealing with something
    // that is flag-like and has hyphen as the first character and has a
    // length of at least two characters. How we handle this potential flag
    // depends on whether or not it is a long-option so we check that first.
    bool is_long_flag = (arg_i_cstr[1] == '-');

    if (is_long_flag) {

      // Long flags have a complication: their arguments can be specified
      // using an '=' character right inside the argument. That means an
      // argument like "--output=foobar.txt" is actually an option with flag
      // "--output" and argument "foobar.txt". So we look for the first
      // instance of the '=' character and keep it in long_flag_arg. If
      // long_flag_arg is nullptr then we didn't find '='. We need the
      // flag_len to construct long_flag_str below.
      auto long_flag_arg = std::strchr(arg_i_cstr, '=');
      std::size_t flag_len = arg_i_len;
      if (long_flag_arg != nullptr) {
        flag_len = long_flag_arg - arg_i_cstr;
      }
      std::string long_flag_str(arg_i_cstr, flag_len);

      if (!map.known_long_flag(long_flag_str)) {
        std::ostringstream msg;
        msg << "found unexpected flag: " << long_flag_str;
        throw unexpected_option_error(msg.str());
      }

      const auto defn = map.get_definition_for_long_flag(long_flag_str);

      if (long_flag_arg != nullptr && defn->num_args == 0) {
        std::ostringstream msg;
        msg << "found argument for option not expecting an argument: "
            << arg_i_cstr;
        throw unexpected_argument_error(msg.str());
      }

      // We've got a legitimate, known long flag option so we add an option
      // result. This option result initially has an arg of nullptr, but that
      // might change in the following block.
      auto& opt_results = results.options[defn->name];
      option_result opt_result {nullptr};
      opt_results.all.push_back(std::move(opt_result));

      if (defn->requires_arguments()) {
        bool there_is_an_equal_delimited_arg = (long_flag_arg != nullptr);
        if (there_is_an_equal_delimited_arg) {
          // long_flag_arg would be "=foo" in the "--output=foo" case so we
          // increment by 1 to get rid of the equal sign.
          opt_results.all.back().arg = long_flag_arg + 1;
        } else {
          last_flag_expecting_args = arg_i_cstr;
          last_option_expecting_args = &(opt_results.all.back());
          num_option_args_to_consume = defn->num_args;
        }
      }

      ++arg_i;
      continue;
    }

    // If we've made it here then we're looking at either a short flag or a
    // group of short flags. Short flags can be grouped together so long as
    // they don't require any arguments unless the option that does is the
    // last in the group ("-o x -v" is okay, "-vo x" is okay, "-ov x" is
    // not). So starting after the dash we're going to process each character
    // as if it were a separate flag. Note "sf_idx" stands for "short flag
    // index".
    for (std::size_t sf_idx = 1; sf_idx < arg_i_len; ++sf_idx) {
      const auto short_flag = arg_i_cstr[sf_idx];

      if (!std::isalnum(short_flag)) {
        std::ostringstream msg;
        msg << "found non-alphanumeric character '" << arg_i_cstr[sf_idx]
            << "' in flag group '" << arg_i_cstr << "'";
        throw std::domain_error(msg.str());
      }

      if (!map.known_short_flag(short_flag)) {
        std::ostringstream msg;
        msg << "found unexpected flag '" << arg_i_cstr[sf_idx]
            << "' in flag group '" << arg_i_cstr << "'";
        throw unexpected_option_error(msg.str());
      }

      auto defn = map.get_definition_for_short_flag(short_flag);
      auto& opt_results = results.options[defn->name];

      // Create an option result with an empty argument (for now) and add it
      // to this option's results.
      option_result opt_result {nullptr};
      opt_results.all.push_back(std::move(opt_result));

      if (defn->requires_arguments()) {

        // If this short flag's option requires an argument and we're the
        // last flag in the short flag group then just put the parser into
        // "expecting argument for last option" state and move onto the next
        // command line argument.
        bool is_last_short_flag_in_group = (sf_idx == arg_i_len - 1);
        if (is_last_short_flag_in_group) {
          last_flag_expecting_args = arg_i_cstr;
          last_option_expecting_args = &(opt_results.all.back());
          num_option_args_to_consume = defn->num_args;
          break;
        }

        // If this short flag's option requires an argument and we're NOT the
        // last flag in the short flag group then we automatically consume
        // the rest of the short flag group as the argument for this flag.
        // This is how we get the POSIX behavior of being able to specify a
        // flag's arguments without a white space delimiter (e.g.
        // "-I/usr/local/include").
        opt_results.all.back().arg = arg_i_cstr + sf_idx + 1;
        break;
      }
    }

    ++arg_i;
    continue;
  }

  // If we're done with all of the arguments but are still expecting
  // arguments for a previous option then we haven't satisfied that option.
  // This is an error.
  if (num_option_args_to_consume > 0) {
    std::ostringstream msg;
    msg << "last option \"" << last_flag_expecting_args
        << "\" expects an argument but the parser ran out of command line "
        << "arguments to parse";
    throw option_lacks_argument_error(msg.str());
  }

  return results;
}